

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::CreateTimestampFromTimeT
          (string *__return_storage_ptr__,cmTimestamp *this,time_t timeT,string *formatString,
          bool utcFlag)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  char local_f9;
  string local_b8;
  char local_95;
  char c2;
  char local_81;
  ulong uStack_80;
  char c1;
  size_type i;
  tm *local_70;
  tm *ptr;
  tm timeStruct;
  bool utcFlag_local;
  string *formatString_local;
  time_t timeT_local;
  cmTimestamp *this_local;
  string *result;
  
  timeStruct.tm_zone._7_1_ = utcFlag;
  formatString_local = (string *)timeT;
  timeT_local = (time_t)this;
  this_local = (cmTimestamp *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (std::__cxx11::string::operator=((string *)formatString,"%Y-%m-%dT%H:%M:%S"),
     (timeStruct.tm_zone._7_1_ & 1) != 0)) {
    std::__cxx11::string::operator+=((string *)formatString,"Z");
  }
  memset(&ptr,0,0x38);
  local_70 = (tm *)0x0;
  if ((timeStruct.tm_zone._7_1_ & 1) == 0) {
    local_70 = localtime((time_t *)&formatString_local);
  }
  else {
    local_70 = gmtime((time_t *)&formatString_local);
  }
  if (local_70 == (tm *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    memcpy(&ptr,local_70,0x38);
    i._7_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (uStack_80 = 0; uVar1 = uStack_80, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
        uStack_80 = uStack_80 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)formatString);
      local_81 = *pcVar3;
      uVar1 = uStack_80 + 1;
      uVar2 = std::__cxx11::string::size();
      if (uVar1 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)formatString);
        local_f9 = *pcVar3;
      }
      else {
        local_f9 = '\0';
      }
      local_95 = local_f9;
      if ((local_81 == '%') && (local_f9 != '\0')) {
        AddTimestampComponent_abi_cxx11_
                  (&local_b8,this,local_f9,(tm *)&ptr,(time_t)formatString_local);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        uStack_80 = uStack_80 + 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_81);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CreateTimestampFromTimeT(time_t timeT,
                                                  std::string formatString,
                                                  bool utcFlag) const
{
  if (formatString.empty()) {
    formatString = "%Y-%m-%dT%H:%M:%S";
    if (utcFlag) {
      formatString += "Z";
    }
  }

  struct tm timeStruct;
  memset(&timeStruct, 0, sizeof(timeStruct));

  struct tm* ptr = nullptr;
  if (utcFlag) {
    ptr = gmtime(&timeT);
  } else {
    ptr = localtime(&timeT);
  }

  if (ptr == nullptr) {
    return std::string();
  }

  timeStruct = *ptr;

  std::string result;
  for (std::string::size_type i = 0; i < formatString.size(); ++i) {
    char c1 = formatString[i];
    char c2 = (i + 1 < formatString.size()) ? formatString[i + 1]
                                            : static_cast<char>(0);

    if (c1 == '%' && c2 != 0) {
      result += AddTimestampComponent(c2, timeStruct, timeT);
      ++i;
    } else {
      result += c1;
    }
  }

  return result;
}